

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O0

vector<hta::Row,_std::allocator<hta::Row>_> * __thiscall
hta::Metric::retrieve
          (vector<hta::Row,_std::allocator<hta::Row>_> *__return_storage_ptr__,Metric *this,
          TimePoint begin,TimePoint end,uint64_t min_samples,IntervalScope scope)

{
  bool bVar1;
  Duration local_70;
  IntervalScope local_68;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> local_60;
  duration<unsigned_long,_std::ratio<1L,_1000000000L>_> local_58;
  duration<unsigned_long,_std::ratio<1L,_1000000000L>_> interval_max_length;
  type duration;
  uint64_t local_38;
  uint64_t min_samples_local;
  Metric *this_local;
  IntervalScope scope_local;
  TimePoint end_local;
  TimePoint begin_local;
  
  local_38 = min_samples;
  min_samples_local = (uint64_t)this;
  this_local = (Metric *)scope;
  scope_local = (IntervalScope)
                end.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r;
  end_local = begin;
  check_read(this);
  bVar1 = std::chrono::operator>
                    (&end_local.
                      super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     ,(time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                       *)&scope_local);
  if (!bVar1) {
    interval_max_length.__r =
         (rep_conflict)
         std::chrono::operator-
                   ((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                     *)&scope_local,
                    &end_local.
                     super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   );
    local_58 = std::chrono::operator/
                         ((duration<long,_std::ratio<1L,_1000000000L>_> *)&interval_max_length,
                          &local_38);
    local_60.__d.__r =
         (duration)
         (duration)
         end_local.
         super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
         __d.__r;
    local_68 = scope_local;
    std::chrono::duration<long,std::ratio<1l,1000000000l>>::
    duration<unsigned_long,std::ratio<1l,1000000000l>,void>
              ((duration<long,std::ratio<1l,1000000000l>> *)&local_70,&local_58);
    retrieve(__return_storage_ptr__,this,(TimePoint)local_60.__d.__r,(TimePoint)local_68,local_70,
             (IntervalScope)this_local);
    return __return_storage_ptr__;
  }
  throw_exception<hta::Exception,char_const*,hta::Clock::time_point,char_const*,hta::Clock::time_point>
            ("Metric::retrieve(min_samples) invalid request: begin timestamp ",
             (time_point)
             end_local.
             super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
             .__d.__r," larger than end timestamp ",(time_point)scope_local);
}

Assistant:

std::vector<Row> Metric::retrieve(TimePoint begin, TimePoint end, uint64_t min_samples,
                                  IntervalScope scope)
{
    check_read();
    if (begin > end)
    {
        throw_exception("Metric::retrieve(min_samples) invalid request: begin timestamp ", begin,
                        " larger than end timestamp ", end);
    }
    auto duration = end - begin;
    auto interval_max_length = duration / min_samples;
    return retrieve(begin, end, interval_max_length, scope);
}